

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab12.c
# Opt level: O2

int FeedFromArray(void)

{
  int iVar1;
  FILE *__stream;
  
  __stream = fopen("in.txt","w+");
  if (__stream == (FILE *)0x0) {
    printf("Can\'t create the file. No space on disk ?");
    __stream = (FILE *)0x0;
  }
  else {
    iVar1 = fprintf(__stream,"%s\n",testInOut[currentTest].in);
    if (-1 < iVar1) {
      fclose(__stream);
      return 0;
    }
    puts("Can\'t create in.txt. No space on disk?");
  }
  fclose(__stream);
  return -1;
}

Assistant:

static int FeedFromArray(void) {
    FILE* fl_In = fopen("in.txt", "w+");
    if (!fl_In) {
        printf("Can't create the file. No space on disk ?");
        fclose(fl_In);
        return -1;
    }
    if (fprintf(fl_In, "%s\n", testInOut[currentTest].in) < 0) {
        printf("Can't create in.txt. No space on disk?\n");
        fclose(fl_In);
        return -1;
    }
    fclose(fl_In);
    return 0;
}